

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::setIconProvider(QFileDialog *this,QAbstractFileIconProvider *provider)

{
  long lVar1;
  bool bVar2;
  QFileDialogPrivate *pQVar3;
  Ui_QFileDialog *pUVar4;
  long in_FS_OFFSET;
  QFileDialogPrivate *d;
  QSidebar *in_stack_ffffffffffffffb8;
  QFileDialogPrivate *in_stack_ffffffffffffffc0;
  QSidebar *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QFileDialog *)0x7595ba);
  bVar2 = QFileDialogPrivate::usingWidgets(in_stack_ffffffffffffffc0);
  if (bVar2) {
    QFileSystemModel::setIconProvider((QAbstractFileIconProvider *)pQVar3->model);
    pUVar4 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                       (&pQVar3->qFileDialogUi);
    this_00 = pUVar4->sidebar;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&pQVar3->qFileDialogUi);
    QSidebar::urls(in_stack_ffffffffffffffb8);
    QSidebar::setUrls(this_00,(QList<QUrl> *)in_stack_ffffffffffffffb8);
    QList<QUrl>::~QList((QList<QUrl> *)0x759637);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialog::setIconProvider(QAbstractFileIconProvider *provider)
{
    Q_D(QFileDialog);
    if (!d->usingWidgets())
        return;
    d->model->setIconProvider(provider);
    //It forces the refresh of all entries in the side bar, then we can get new icons
    d->qFileDialogUi->sidebar->setUrls(d->qFileDialogUi->sidebar->urls());
}